

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clear(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  pointer pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar2;
  long lVar3;
  
  if (this->setupStatus == true) {
    if (0 < (this->super_IdxSet).num) {
      lVar3 = 0;
      do {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(this->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(this->super_IdxSet).idx[lVar3]].
                    m_backend,0);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (this->super_IdxSet).num);
    }
  }
  else {
    pnVar1 = (this->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar2 = (this->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar1; pnVar2 = pnVar2 + 1)
    {
      (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar2->m_backend).prec_elem = 0x1c;
      (pnVar2->m_backend).data._M_elems[0] = 0;
      (pnVar2->m_backend).data._M_elems[1] = 0;
      (pnVar2->m_backend).data._M_elems[2] = 0;
      (pnVar2->m_backend).data._M_elems[3] = 0;
      (pnVar2->m_backend).data._M_elems[4] = 0;
      (pnVar2->m_backend).data._M_elems[5] = 0;
      (pnVar2->m_backend).data._M_elems[6] = 0;
      (pnVar2->m_backend).data._M_elems[7] = 0;
      (pnVar2->m_backend).data._M_elems[8] = 0;
      (pnVar2->m_backend).data._M_elems[9] = 0;
      (pnVar2->m_backend).data._M_elems[10] = 0;
      (pnVar2->m_backend).data._M_elems[0xb] = 0;
      (pnVar2->m_backend).data._M_elems[0xc] = 0;
      (pnVar2->m_backend).data._M_elems[0xd] = 0;
      (pnVar2->m_backend).data._M_elems[0xe] = 0;
      (pnVar2->m_backend).data._M_elems[0xf] = 0;
      (pnVar2->m_backend).data._M_elems[0x10] = 0;
      (pnVar2->m_backend).data._M_elems[0x11] = 0;
      (pnVar2->m_backend).data._M_elems[0x12] = 0;
      (pnVar2->m_backend).data._M_elems[0x13] = 0;
      (pnVar2->m_backend).data._M_elems[0x14] = 0;
      (pnVar2->m_backend).data._M_elems[0x15] = 0;
      (pnVar2->m_backend).data._M_elems[0x16] = 0;
      (pnVar2->m_backend).data._M_elems[0x17] = 0;
      (pnVar2->m_backend).data._M_elems[0x18] = 0;
      (pnVar2->m_backend).data._M_elems[0x19] = 0;
      (pnVar2->m_backend).data._M_elems[0x1a] = 0;
      (pnVar2->m_backend).data._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x6d) = 0;
    }
  }
  (this->super_IdxSet).num = 0;
  this->setupStatus = true;
  return;
}

Assistant:

void clear()
   {
      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            VectorBase<R>::val[idx[i]] = 0;
      }
      else
         VectorBase<R>::clear();

      IdxSet::clear();
      setupStatus = true;

      assert(isConsistent());
   }